

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSS.cpp
# Opt level: O2

void __thiscall NaPNStateSpace::action(NaPNStateSpace *this)

{
  int iVar1;
  int iVar2;
  NaVector *pNVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 *puVar4;
  NaStateSpaceModel *pNVar5;
  
  pNVar5 = this->m_pSSModel;
  if (pNVar5 == (NaStateSpaceModel *)0x0) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0;
    __cxa_throw(puVar4,&NaException::typeinfo,0);
  }
  if ((this->super_NaPetriNode).bVerbose == true) {
    NaPrintLog(
              "           *************************\n           * Internal state change *\n           *************************\n"
              );
    NaPrintLog("### x(t): ");
    pNVar3 = NaPetriCnOutput::data(&this->x);
    (*pNVar3->_vptr_NaVector[0x1f])(pNVar3);
    NaPrintLog("### y(t): ");
    pNVar3 = NaPetriCnOutput::data(&this->y);
    (*pNVar3->_vptr_NaVector[0x1f])(pNVar3);
    pNVar5 = this->m_pSSModel;
  }
  pNVar3 = NaPetriCnInput::data(&this->u);
  iVar1 = (*pNVar3->_vptr_NaVector[8])(pNVar3,0);
  pNVar3 = NaPetriCnOutput::data(&this->y);
  iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,0);
  (*(pNVar5->super_NaUnit).super_NaLogging._vptr_NaLogging[6])
            (pNVar5,CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2));
  pNVar5 = this->m_pSSModel;
  pNVar3 = NaPetriCnOutput::data(&this->x);
  (*(pNVar5->super_NaUnit).super_NaLogging._vptr_NaLogging[0x17])(pNVar5,pNVar3);
  if ((this->super_NaPetriNode).bVerbose == true) {
    NaPrintLog("### x(t+1): ");
    pNVar3 = NaPetriCnOutput::data(&this->x);
    (*pNVar3->_vptr_NaVector[0x1f])(pNVar3);
    return;
  }
  return;
}

Assistant:

void
NaPNStateSpace::action ()
{
    if(NULL == m_pSSModel){
      throw(na_null_pointer);
    }

    //           *************************
    //           * Internal state change *
    //           *************************

    if(bVerbose){
        NaPrintLog("           *************************\n"
                   "           * Internal state change *\n"
                   "           *************************\n");

        NaPrintLog("### x(t): ");
        x.data().print_contents();

        NaPrintLog("### y(t): ");
        y.data().print_contents();
    }

    m_pSSModel->Function(&u.data()[0], &y.data()[0]);
    m_pSSModel->GetState(x.data());

    if(bVerbose){
        NaPrintLog("### x(t+1): ");
        x.data().print_contents();
    }
}